

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O2

int Sbd_StoComputeCutsNode(Sbd_Sto_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  
  pGVar3 = Gia_ManObj(p->pGia,iObj);
  iVar1 = Vec_IntEntry(p->vLevels,iObj - (*(uint *)pGVar3 & 0x1fffffff));
  iVar2 = Vec_IntEntry(p->vLevels,iObj - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff));
  if (iVar1 <= iVar2) {
    iVar1 = iVar2;
  }
  Sbd_StoComputeCutsObj(p,iObj,-1,iVar1 + 1);
  Sbd_StoMergeCuts(p,iObj);
  iVar1 = Vec_IntEntry(p->vDelays,iObj);
  return iVar1;
}

Assistant:

int Sbd_StoComputeCutsNode( Sbd_Sto_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int Lev0 = Vec_IntEntry( p->vLevels, Gia_ObjFaninId0(pObj, iObj) );
    int Lev1 = Vec_IntEntry( p->vLevels, Gia_ObjFaninId1(pObj, iObj) );
    Sbd_StoComputeCutsObj( p, iObj, -1, 1 + Abc_MaxInt(Lev0, Lev1) );
    Sbd_StoMergeCuts( p, iObj );
    return Vec_IntEntry( p->vDelays, iObj );
}